

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O1

void __thiscall
Memory::ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>::ArenaAllocatorBase
          (ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL> *this,
          LPCWSTR name,PageAllocator *pageAllocator,_func_void *outOfMemoryFunc,
          _func_void *recoverMemoryFunc)

{
  ArenaMemoryData *pAVar1;
  
  (this->super_Allocator).outOfMemoryFunc = outOfMemoryFunc;
  (this->super_Allocator).recoverMemoryFunc = recoverMemoryFunc;
  (this->super_ArenaData).bigBlocks = (BigBlock *)0x0;
  (this->super_ArenaData).fullBlocks = (BigBlock *)0x0;
  (this->super_ArenaData).mallocBlocks = (ArenaMemoryBlock *)0x0;
  (this->super_ArenaData).pageAllocator = pageAllocator;
  (this->super_ArenaData).cacheBlockCurrent = (char *)0x0;
  (this->super_ArenaData).lockBlockList = false;
  (this->cacheBlockEnd).ptr = (Type)0x3;
  this->largestHole = 0;
  this->blockState = 0;
  this->freeListSize = 0;
  this->freeList = (void *)0x0;
  this->name = name;
  pAVar1 = MemoryProfiler::Begin(name);
  this->memoryData = pAVar1;
  this->needsDelayFreeList = false;
  ArenaMemoryTracking::ArenaCreated(&this->super_Allocator,name);
  return;
}

Assistant:

ArenaAllocatorBase<TFreeListPolicy, ObjectAlignmentBitShiftArg, RequireObjectAlignment, MaxObjectSize>::
ArenaAllocatorBase(__in LPCWSTR name, PageAllocator * pageAllocator, void(*outOfMemoryFunc)(), void(*recoverMemoryFunc)()) :
    Allocator(outOfMemoryFunc, recoverMemoryFunc),
    ArenaData(pageAllocator),
#ifdef ARENA_ALLOCATOR_FREE_LIST_SIZE
    freeListSize(0),
#endif
    freeList(nullptr),
    largestHole(0),
    cacheBlockEnd(nullptr),
    blockState(0)
{
#ifdef PROFILE_MEM
    this->name = name;
    LogBegin();
#endif
#if DBG
    needsDelayFreeList = false;
#endif
    ArenaMemoryTracking::ArenaCreated(this, name);
}